

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
          (string *__return_storage_ptr__,NegativeGLSLCompileTimeErrors *this,int x,int y,int z)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(&local_198,"#version 430 core\nlayout(local_size_x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this);
  poVar1 = std::operator<<(poVar1,", local_size_y = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1,", local_size_z = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::operator<<(poVar1,
                  ") in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string Shader1(int x, int y, int z)
	{
		std::stringstream ss;
		ss << "#version 430 core" NL "layout(local_size_x = " << x << ", local_size_y = " << y
		   << ", local_size_z = " << z << ") in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
										  "void main() {" NL "  g_output[gl_GlobalInvocationID.x] = 0;" NL "}";
		return ss.str();
	}